

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O3

void __thiscall IGameController::DoTeamBalance(IGameController *this)

{
  IConsole *pIVar1;
  CGameContext *pCVar2;
  IServer *pIVar3;
  CPlayer *pCVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  CPlayer *pCVar10;
  int i;
  uint Team;
  long lVar11;
  int i_1;
  ulong uVar12;
  long in_FS_OFFSET;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float aPlayerScore [64];
  float aTeamScore [2];
  float local_148 [66];
  float local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_GameFlags & 1) != 0) && (this->m_pConfig->m_SvTeambalanceTime != 0)) {
    uVar6 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
    uVar9 = -uVar6;
    if (0 < (int)uVar6) {
      uVar9 = uVar6;
    }
    if (1 < uVar9) {
      pIVar1 = this->m_pGameServer->m_pConsole;
      lVar11 = 0;
      (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,2,"game","Balancing teams",0);
      local_40[0] = 0.0;
      local_40[1] = 0.0;
      memset(local_148,0,0x100);
      pCVar2 = this->m_pGameServer;
      pIVar3 = this->m_pServer;
      do {
        pCVar10 = pCVar2->m_apPlayers[lVar11];
        if ((pCVar10 != (CPlayer *)0x0) && (lVar8 = (long)pCVar10->m_Team, lVar8 != -1)) {
          fVar14 = ((float)(pIVar3->m_TickSpeed * pCVar10->m_Score) * 60.0) /
                   (float)(pIVar3->m_CurrentGameTick - pCVar10->m_ScoreStartTick);
          local_148[lVar11] = fVar14;
          local_40[lVar8] = fVar14 + local_40[lVar8];
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x40);
      uVar6 = this->m_aTeamSize[0] - this->m_aTeamSize[1];
      bVar5 = uVar6 == 0 || this->m_aTeamSize[0] < this->m_aTeamSize[1];
      uVar9 = -uVar6;
      if (0 < (int)uVar6) {
        uVar9 = uVar6;
      }
      uVar9 = uVar9 >> 1;
      fVar14 = local_40[bVar5];
      uVar6 = (uint)bVar5;
      Team = uVar6 ^ 1;
      do {
        uVar12 = 0;
        pCVar10 = (CPlayer *)0x0;
        fVar17 = fVar14;
        do {
          if (this->m_pGameServer->m_apPlayers[uVar12] != (CPlayer *)0x0) {
            iVar7 = (**this->_vptr_IGameController)(this,uVar12 & 0xffffffff);
            if (((char)iVar7 != '\0') &&
               (pCVar4 = this->m_pGameServer->m_apPlayers[uVar12], pCVar4->m_Team == uVar6)) {
              fVar13 = (local_40[Team] + local_148[uVar12]) - (fVar14 - local_148[uVar12]);
              fVar15 = -fVar13;
              if (pCVar10 != (CPlayer *)0x0) {
                fVar16 = fVar15;
                if (fVar15 <= fVar13) {
                  fVar16 = fVar13;
                }
                if (fVar17 <= fVar16) goto LAB_0011f3c8;
              }
              fVar17 = (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar13 |
                              (uint)fVar15 & -(uint)(fVar13 < 0.0));
              pCVar10 = pCVar4;
            }
          }
LAB_0011f3c8:
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0x40);
        if (pCVar10 != (CPlayer *)0x0) {
          iVar7 = pCVar10->m_LastActionTick;
          DoTeamChange(this,pCVar10,Team,true);
          pCVar10->m_LastActionTick = iVar7;
          CPlayer::Respawn(pCVar10);
          CGameContext::SendGameMsg(this->m_pGameServer,7,pCVar10->m_Team,pCVar10->m_ClientID);
        }
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
      this->m_UnbalancedTick = -1;
      CGameContext::SendGameMsg(this->m_pGameServer,3,-1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void IGameController::DoTeamBalance()
{
	if(!IsTeamplay() || !Config()->m_SvTeambalanceTime || absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) < NUM_TEAMS)
		return;

	GameServer()->Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "game", "Balancing teams");

	float aTeamScore[NUM_TEAMS] = {0};
	float aPlayerScore[MAX_CLIENTS] = {0.0f};

	// gather stats
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		if(GameServer()->m_apPlayers[i] && GameServer()->m_apPlayers[i]->GetTeam() != TEAM_SPECTATORS)
		{
			aPlayerScore[i] = GameServer()->m_apPlayers[i]->m_Score*Server()->TickSpeed()*60.0f/
				(Server()->Tick()-GameServer()->m_apPlayers[i]->m_ScoreStartTick);
			aTeamScore[GameServer()->m_apPlayers[i]->GetTeam()] += aPlayerScore[i];
		}
	}

	int BiggerTeam = (m_aTeamSize[TEAM_RED] > m_aTeamSize[TEAM_BLUE]) ? TEAM_RED : TEAM_BLUE;
	int NumBalance = absolute(m_aTeamSize[TEAM_RED]-m_aTeamSize[TEAM_BLUE]) / NUM_TEAMS;

	// balance teams
	do
	{
		CPlayer *pPlayer = 0;
		float ScoreDiff = aTeamScore[BiggerTeam];
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			if(!GameServer()->m_apPlayers[i] || !CanBeMovedOnBalance(i))
				continue;

			// remember the player whom would cause lowest score-difference
			if(GameServer()->m_apPlayers[i]->GetTeam() == BiggerTeam &&
				(!pPlayer || absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i])) < ScoreDiff))
			{
				pPlayer = GameServer()->m_apPlayers[i];
				ScoreDiff = absolute((aTeamScore[BiggerTeam^1]+aPlayerScore[i]) - (aTeamScore[BiggerTeam]-aPlayerScore[i]));
			}
		}

		// move the player to the other team
		if(pPlayer)
		{
			int Temp = pPlayer->m_LastActionTick;
			DoTeamChange(pPlayer, BiggerTeam^1);
			pPlayer->m_LastActionTick = Temp;
			pPlayer->Respawn();
			GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE_VICTIM, pPlayer->GetTeam(), pPlayer->GetCID());
		}
	}
	while(--NumBalance);

	m_UnbalancedTick = TBALANCE_OK;
	GameServer()->SendGameMsg(GAMEMSG_TEAM_BALANCE, -1);
}